

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midi_processor_standard_midi.cpp
# Opt level: O2

void midi_processor::process_standard_midi_track
               (const_iterator *it,const_iterator end,midi_container *p_out,bool is_gmf)

{
  byte bVar1;
  uchar uVar2;
  byte *pbVar3;
  uchar *puVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  size_t p_data_count;
  uint uVar10;
  byte bVar11;
  byte local_e9;
  ulong local_e0;
  ulong local_d8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  midi_track track;
  midi_event local_78;
  midi_container *local_38;
  
  track.m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  track.m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  track.m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38 = p_out;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&buffer,3);
  local_e9 = 0xff;
  local_e0 = 0;
  local_d8 = 0;
  uVar7 = 0;
  while( true ) {
    uVar8 = (ulong)uVar7;
    uVar10 = uVar7;
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            if (it->_M_current == end._M_current) goto LAB_0010eecb;
            uVar6 = decode_delta(it,end);
            pbVar3 = it->_M_current;
            if (pbVar3 == end._M_current) goto LAB_0010eecb;
            uVar5 = -uVar6;
            if (0 < (int)uVar6) {
              uVar5 = uVar6;
            }
            if (1000000 < uVar5) goto LAB_0010eecb;
            it->_M_current = pbVar3 + 1;
            bVar1 = *pbVar3;
            bVar11 = bVar1;
            if (-1 < (char)bVar1) {
              if (local_e9 == 0xff) goto LAB_0010eecb;
              *buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start = bVar1;
              bVar11 = local_e9;
            }
            uVar10 = uVar10 + uVar5;
            uVar6 = (uint)bVar11;
            if (0xef < bVar11) break;
            if ((int)local_e0 != 0) {
              midi_event::midi_event
                        (&local_78,uVar8,extended,0,
                         buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start,local_e0);
              midi_track::add_event(&track,&local_78);
              std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                        (&local_78.m_ext_data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
              local_d8 = (ulong)uVar7;
            }
            local_e0 = 0;
            local_e9 = bVar11;
            if (!is_gmf || (uVar6 & 0xfffffff0) != 0xe0) {
              if ((char)bVar1 < '\0') {
                puVar4 = it->_M_current;
                if (puVar4 == end._M_current) goto LAB_0010eecb;
                it->_M_current = puVar4 + 1;
                *buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start = *puVar4;
              }
              p_data_count = 1;
              if ((bVar11 & 0xe0 | 0x10) != 0xd0) {
                puVar4 = it->_M_current;
                if (puVar4 == end._M_current) goto LAB_0010eecb;
                it->_M_current = puVar4 + 1;
                buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start[1] = *puVar4;
                p_data_count = 2;
              }
              midi_event::midi_event
                        (&local_78,(ulong)uVar10,(bVar11 >> 4) + ~extended,uVar6 & 0xf,
                         buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start,p_data_count);
              midi_track::add_event(&track,&local_78);
              std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                        (&local_78.m_ext_data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
              local_d8 = (ulong)uVar10;
            }
          }
          if (bVar11 != 0xff) break;
          if ((int)local_e0 != 0) {
            midi_event::midi_event
                      (&local_78,uVar8,extended,0,
                       buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start,local_e0);
            midi_track::add_event(&track,&local_78);
            std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                      (&local_78.m_ext_data.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
            local_d8 = (ulong)uVar7;
          }
          puVar4 = it->_M_current;
          if ((puVar4 == end._M_current) ||
             (it->_M_current = puVar4 + 1, puVar4 + 1 == end._M_current)) goto LAB_0010eecb;
          uVar2 = *puVar4;
          uVar6 = decode_delta(it,end);
          if (((int)uVar6 < 0) ||
             (uVar9 = (ulong)uVar6, (long)end._M_current - (long)it->_M_current < (long)uVar9))
          goto LAB_0010eecb;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    (&buffer,(ulong)(uVar6 + 2));
          *buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start = 0xff;
          buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start[1] = uVar2;
          if (uVar6 != 0) {
            memmove(buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                    .super__Vector_impl_data._M_start + 2,it->_M_current,uVar9);
          }
          it->_M_current = it->_M_current + uVar9;
          if (uVar2 != '/') {
            local_d8 = (ulong)uVar10;
          }
          midi_event::midi_event
                    (&local_78,local_d8,extended,0,
                     buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,(ulong)(uVar6 + 2));
          midi_track::add_event(&track,&local_78);
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    (&local_78.m_ext_data.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
          local_e0 = 0;
          local_d8 = (ulong)uVar10;
          if (uVar2 == '/') goto LAB_0010ef1a;
        }
        if (uVar6 != 0xf7) break;
        if (((((int)local_e0 == 0) || (it->_M_current == end._M_current)) ||
            (uVar6 = decode_delta(it,end), (int)uVar6 < 0)) ||
           (uVar9 = (ulong)uVar6, (long)end._M_current - (long)it->_M_current < (long)uVar9))
        goto LAB_0010eecb;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  (&buffer,(ulong)((int)local_e0 + uVar6));
        if (uVar6 != 0) {
          memmove(buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start + local_e0,it->_M_current,uVar9);
        }
        it->_M_current = it->_M_current + uVar9;
        local_e0 = (ulong)((int)local_e0 + uVar6);
      }
      if (uVar6 == 0xf0) break;
      if (bVar11 < 0xf8) goto LAB_0010eecb;
      *buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start = bVar11;
      midi_event::midi_event
                (&local_78,(ulong)uVar10,extended,0,
                 buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start,1);
      midi_track::add_event(&track,&local_78);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&local_78.m_ext_data.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      local_d8 = (ulong)uVar10;
    }
    if ((int)local_e0 != 0) {
      midi_event::midi_event
                (&local_78,uVar8,extended,0,
                 buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start,local_e0);
      midi_track::add_event(&track,&local_78);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&local_78.m_ext_data.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      local_d8 = (ulong)uVar7;
    }
    if (((it->_M_current == end._M_current) || (uVar7 = decode_delta(it,end), (int)uVar7 < 0)) ||
       (uVar8 = (ulong)uVar7, (long)end._M_current - (long)it->_M_current < (long)uVar8)) break;
    local_e0 = (ulong)(uVar7 + 1);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&buffer,local_e0);
    *buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
     super__Vector_impl_data._M_start = 0xf0;
    if (uVar7 != 0) {
      memmove(buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start + 1,it->_M_current,uVar8);
    }
    it->_M_current = it->_M_current + uVar8;
    uVar7 = uVar10;
  }
LAB_0010eecb:
  *buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
   super__Vector_impl_data._M_start = 0xff;
  buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[1] = '/';
  midi_event::midi_event
            (&local_78,local_d8,extended,0,
             buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,2);
  midi_track::add_event(&track,&local_78);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&local_78.m_ext_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
  ;
LAB_0010ef1a:
  midi_container::add_track(local_38,&track);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::vector<midi_event,_std::allocator<midi_event>_>::~vector(&track.m_events);
  return;
}

Assistant:

void midi_processor::process_standard_midi_track( std::vector<uint8_t>::const_iterator & it, std::vector<uint8_t>::const_iterator end, midi_container & p_out, bool is_gmf )
{
    bool needs_end_marker = false;

    midi_track track;
    unsigned current_timestamp = 0;
    unsigned last_event_timestamp = 0;
    unsigned char last_event_code = 0xFF;

    unsigned last_sysex_length = 0;
    unsigned last_sysex_timestamp = 0;

    std::vector<uint8_t> buffer;
    buffer.resize( 3 );

    for (;;)
    {
        if ( !needs_end_marker && it == end ) break;
        int delta = decode_delta( it, end );
        if ( !needs_end_marker && it == end ) break;

        if ( delta < 0 )
        {
            /*"MIDI processor encountered negative delta: " << delta << "; flipping sign.";*/
            delta = -delta;
        }
        
        if ( delta > 1000000 )
            break;

        current_timestamp += delta;
        if ( it == end ) break;
        unsigned char event_code = *it++;
        unsigned data_bytes_read = 0;
        if ( event_code < 0x80 )
        {
            if ( last_event_code == 0xFF ) break; /*throw exception_io_data("First MIDI track event short encoded");*/
            buffer[ data_bytes_read++ ] = event_code;
            event_code = last_event_code;
        }
        if ( event_code < 0xF0 )
        {
            if ( last_sysex_length )
            {
                track.add_event( midi_event( last_event_timestamp = last_sysex_timestamp, midi_event::extended, 0, &buffer[0], last_sysex_length ) );
                last_sysex_length = 0;
            }

            last_event_code = event_code;
            if ( is_gmf && ( event_code & 0xF0 ) == 0xE0 ) continue;
            if ( data_bytes_read < 1 )
            {
                if ( it == end ) break;
                buffer[ 0 ] = *it++;
                ++data_bytes_read;
            }
            bool command_valid = true;
            switch ( event_code & 0xF0 )
            {
            case 0xC0:
            case 0xD0:
                break;
            default:
                if ( it == end )
                {
                    command_valid = false;
                    break;
                }
                buffer[ data_bytes_read ] = *it++;
                ++data_bytes_read;
            }
            if ( !command_valid ) break;
            track.add_event( midi_event( last_event_timestamp = current_timestamp, (midi_event::event_type)(( event_code >> 4 ) - 8), event_code & 0x0F, &buffer[0], data_bytes_read ) );
        }
        else if ( event_code == 0xF0 )
        {
            if ( last_sysex_length )
            {
                track.add_event( midi_event( last_event_timestamp = last_sysex_timestamp, midi_event::extended, 0, &buffer[0], last_sysex_length ) );
                last_sysex_length = 0;
            }

            if ( it == end ) break;
            int data_count = decode_delta( it, end );
            if ( data_count < 0 ) break; /*throw exception_io_data( "Invalid System Exclusive message" );*/
            if ( end - it < data_count ) break;
            buffer.resize( data_count + 1 );
            buffer[ 0 ] = 0xF0;
            std::copy( it, it + data_count, buffer.begin() + 1 );
            it += data_count;
            last_sysex_length = data_count + 1;
            last_sysex_timestamp = current_timestamp;
        }
        else if ( event_code == 0xF7 ) // SysEx continuation
        {
            if ( !last_sysex_length ) break;
            if ( it == end ) break;
            int data_count = decode_delta( it, end );
            if ( data_count < 0 ) break;
            if ( end - it < data_count ) break;
            buffer.resize( last_sysex_length + data_count );
            std::copy( it, it + data_count, buffer.begin() + last_sysex_length );
            it += data_count;
            last_sysex_length += data_count;
        }
        else if ( event_code == 0xFF )
        {
            if ( last_sysex_length )
            {
                track.add_event( midi_event( last_event_timestamp = last_sysex_timestamp, midi_event::extended, 0, &buffer[0], last_sysex_length ) );
                last_sysex_length = 0;
            }

            if ( it == end ) break;
            unsigned char meta_type = *it++;
            if ( it == end ) break;
            int data_count = decode_delta( it, end );
            if ( data_count < 0 ) break; /*throw exception_io_data( "Invalid meta message" );*/
            if ( end - it < data_count ) break;
            buffer.resize( data_count + 2 );
            buffer[ 0 ] = 0xFF;
            buffer[ 1 ] = meta_type;
            std::copy( it, it + data_count, buffer.begin() + 2 );
            it += data_count;
            if ( meta_type == 0x2F )
                current_timestamp = last_event_timestamp;
            else
                last_event_timestamp = current_timestamp;
            track.add_event( midi_event( current_timestamp, midi_event::extended, 0, &buffer[0], data_count + 2 ) );

            if ( meta_type == 0x2F )
            {
                needs_end_marker = true;
                break;
            }
        }
        else if ( event_code >= 0xF8 && event_code <= 0xFE )
        {
            /* Sequencer specific events, single byte */
            buffer[ 0 ] = event_code;
            track.add_event( midi_event( last_event_timestamp = current_timestamp, midi_event::extended, 0, &buffer[0], 1 ) );
        }
        else break; /*throw exception_io_data("Unhandled MIDI status code");*/
    }

    if ( !needs_end_marker )
    {
        buffer[ 0 ] = 0xFF;
        buffer[ 1 ] = 0x2F;
        track.add_event( midi_event( last_event_timestamp, midi_event::extended, 0, &buffer[0], 2 ) );
    }

    p_out.add_track( track );
}